

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithiutil.cpp
# Opt level: O2

size_t ithi_copy_to_safe_text(char *text,size_t text_max,uint8_t *x_in,size_t l_in)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar5 = 0;
  bVar2 = true;
  uVar3 = 0;
  do {
    uVar6 = (ulong)uVar5;
    if ((l_in <= uVar6) || (uVar4 = uVar3 + 1, text_max <= uVar4)) {
      if (uVar3 < text_max) {
        text[uVar3] = '\0';
      }
      return uVar3;
    }
    bVar1 = x_in[uVar6];
    bVar7 = (byte)(bVar1 + 0x81) < 0xa2;
    if (bVar7) {
      if ((bVar1 == 0x20) && (!(bool)(l_in - 1 == uVar6 | bVar2))) goto LAB_00170afc;
LAB_00170b12:
      if (uVar3 + 5 < text_max) {
        text[uVar3] = '\\';
        text[uVar3 + 1] = bVar1 / 100 | 0x30;
        text[uVar3 + 2] = (byte)((ushort)((ushort)bVar1 % 100) / 10) | 0x30;
        text[uVar3 + 3] = bVar1 % 10 | 0x30;
        uVar4 = uVar3 + 4;
      }
      else {
        text[uVar3] = '!';
      }
    }
    else {
      if (((bVar1 < 0x2d) && ((0x108400000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
         (uVar6 == 0 && bVar1 == 0x3d)) goto LAB_00170b12;
LAB_00170afc:
      text[uVar3] = bVar1;
      bVar2 = bVar7;
    }
    uVar5 = uVar5 + 1;
    uVar3 = uVar4;
  } while( true );
}

Assistant:

size_t ithi_copy_to_safe_text(char* text, size_t text_max, uint8_t * x_in, size_t l_in)
{
    size_t text_length = 0;
    bool previous_was_space = true; /* Cannot have space at beginning */

    /* escape any non printable character */
    for (uint32_t i = 0; i < l_in && text_length + 1 < text_max; i++)
    {
        int x = x_in[i];
        bool should_escape = false;

        if (x > ' ' && x < 127 && x != '"' && x != ',' && x != '"' && x != '\''
            && (x != '=' || i > 0))
        {
            previous_was_space = false;
        }
        else if (x == ' ' && !previous_was_space && i != l_in - 1)
        {
            /* Cannot have several spaces */
            previous_was_space = true;
        }
        else
        {
            should_escape = true;
        }

        if (should_escape) {
            if (text_length + 5 < text_max) {
                text[text_length++] = '\\';
                text[text_length++] = '0' + (x / 100);
                text[text_length++] = '0' + (x % 100) / 10;
                text[text_length++] = '0' + x % 10;
            }
            else {
                text[text_length++] = '!';
            }
        }
        else {
            text[text_length++] = (char)x;
        }
    }

    if (text_length < text_max) {
        text[text_length] = 0;
    }

    return (text_length);
}